

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O0

el_status_t do_insert_hist(char *p)

{
  char *p_local;
  
  if (p == (char *)0x0) {
    p_local._4_4_ = el_ring_bell();
  }
  else {
    clear_line();
    rl_point = 0;
    reposition(-1);
    rl_end = 0;
    p_local._4_4_ = insert_string(p);
  }
  return p_local._4_4_;
}

Assistant:

static el_status_t do_insert_hist(const char *p)
{
    if (p == NULL)
        return el_ring_bell();

    clear_line();

    rl_point = 0;
    reposition(EOF);
    rl_end = 0;

    return insert_string(p);
}